

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_tbz.c
# Opt level: O1

void test_read_format_tbz(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *_a;
  archive_entry *ae;
  archive_entry *local_30;
  
  _a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_tbz.c"
                   ,L')',(uint)(_a != (archive *)0x0),"(a = archive_read_new()) != NULL",(void *)0x0
                  );
  iVar1 = archive_read_support_filter_bzip2(_a);
  if (iVar1 != 0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_tbz.c"
                   ,L',');
    test_skipping("Bzip2 support");
    archive_read_free(_a);
    return;
  }
  iVar1 = archive_read_support_format_all(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_tbz.c"
                      ,L'0',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",_a);
  iVar1 = archive_read_open_memory(_a,archive,0x70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_tbz.c"
                      ,L'2',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_open_memory(a, archive, sizeof(archive))",_a);
  iVar1 = archive_read_next_header(_a,&local_30);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_tbz.c"
                      ,L'3',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",_a);
  iVar1 = archive_file_count(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_tbz.c"
                      ,L'4',1,"1",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_filter_code(_a,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_tbz.c"
                      ,L'5',(long)iVar1,"archive_filter_code(a, 0)",2,"ARCHIVE_FILTER_BZIP2",
                      (void *)0x0);
  iVar1 = archive_format(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_tbz.c"
                      ,L'6',(long)iVar1,"archive_format(a)",0x30001,"ARCHIVE_FORMAT_TAR_USTAR",
                      (void *)0x0);
  wVar2 = archive_entry_is_encrypted(local_30);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_tbz.c"
                      ,L'7',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_tbz.c"
                      ,L'8',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",_a);
  iVar1 = archive_read_close(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_tbz.c"
                      ,L'9',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",_a);
  iVar1 = archive_read_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_tbz.c"
                      ,L':',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_tbz)
{
	struct archive_entry *ae;
	struct archive *a;
	int r;

	assert((a = archive_read_new()) != NULL);
	r = archive_read_support_filter_bzip2(a);
	if (r != ARCHIVE_OK) {
		skipping("Bzip2 support");
		archive_read_free(a);
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, archive, sizeof(archive)));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_file_count(a));
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_BZIP2);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_USTAR);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}